

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O2

void __thiscall
r_exec::PMDLController::register_predicted_goal_outcome
          (PMDLController *this,Fact *goal,HLPBindingMap *bm,Fact *f_imdl,bool success,
          bool injected_goal)

{
  char cVar1;
  _Fact *this_00;
  Goal *this_01;
  _Fact *this_02;
  uint64_t deadline;
  uint64_t uVar2;
  Sim *this_03;
  GMonitor *this_04;
  Fact *s;
  undefined7 in_register_00000081;
  
  if ((int)CONCAT71(in_register_00000081,success) != 0) {
    (**(code **)((long)(goal->super__Fact).super_LObject.
                       super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                       super__Object._vptr__Object + 0x78))(goal);
    return;
  }
  this_00 = &goal->super__Fact;
  if (injected_goal) {
    s = goal;
    cVar1 = (**(code **)((long)(goal->super__Fact).super_LObject.
                               super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                               super_Code.super__Object._vptr__Object + 0x70))(goal);
    if (cVar1 == '\0') {
      return;
    }
    this_00 = (_Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
    Fact::Fact((Fact *)this_00,goal);
    this_01 = _Fact::get_goal(this_00);
    this_02 = Goal::get_target(this_01);
    deadline = _Fact::get_before(this_02);
    uVar2 = (*Now)();
    uVar2 = get_sim_thz(this,uVar2,deadline);
    this_03 = (Sim *)operator_new(0x50);
    Sim::Sim(this_03,SIM_ROOT,uVar2,
             (Fact *)(this_01->sim).object[2].refCount.super___atomic_base<long>._M_i,false,
             (Controller *)this);
    core::P<r_exec::Sim>::operator=(&this_01->sim,this_03);
    this_04 = (GMonitor *)operator_new(200);
    GMonitor::GMonitor(this_04,this,&bm->super_BindingMap,deadline,uVar2,(Fact *)this_00,f_imdl,
                       (_Fact *)0x0);
    add_g_monitor(this,(_GMonitor *)this_04);
  }
  inject_goal(this,bm,(Fact *)this_00,f_imdl);
  return;
}

Assistant:

void PMDLController::register_predicted_goal_outcome(Fact *goal, HLPBindingMap *bm, Fact *f_imdl, bool success, bool injected_goal)   // called only for SIM_COMMITTED mode.
{
    if (success) {
        goal->invalidate();    // monitor still running to detect failures (actual or predicted).
    } else {
        if (!injected_goal) { // the goal has not been injected; monitor still running.
            inject_goal(bm, goal, f_imdl);
        } else {
            if (goal->is_invalidated()) { // the only case when the goal can be invalidated here is when a predicted failure follows a predicted success.
                Fact *new_goal = new Fact(goal);
                Goal *g = new_goal->get_goal();
                uint64_t deadline = g->get_target()->get_before();
                uint64_t sim_thz = get_sim_thz(Now(), deadline);
                Sim *new_sim = new Sim(SIM_ROOT, sim_thz, g->sim->super_goal, false, this);
                g->sim = new_sim;
                add_g_monitor(new GMonitor(this, bm, deadline, sim_thz, new_goal, f_imdl, nullptr));
                inject_goal(bm, new_goal, f_imdl);
            }
        }
    }
}